

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-name-number-tree.cc
# Opt level: O1

int main(int argc,char **argv)

{
  uint __len;
  char cVar1;
  int iVar2;
  undefined8 *puVar3;
  ostream *poVar4;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
  *ppVar5;
  char *pcVar6;
  long *plVar7;
  undefined8 extraout_RAX;
  long *plVar8;
  QPDFNumberTreeObjectHelper *__range1;
  ulong uVar9;
  element_type *peVar10;
  bool bVar11;
  QPDFObjectHandle QVar12;
  QPDFObjectHandle QVar13;
  QPDFObjectHandle QVar14;
  QPDFObjectHandle QVar15;
  QPDFObjectHandle QVar16;
  QPDFObjectHandle QVar17;
  QPDFObjectHandle QVar18;
  QPDFNumberTreeObjectHelper number_tree;
  QPDFWriter w;
  iterator iter2;
  iterator iter;
  QPDF qpdf;
  iterator __end1_3;
  QPDFObjectHandle obj;
  QPDFNameTreeObjectHelper name_tree;
  QPDFObjectHandle names;
  QPDFObjectHandle name_tree_oh;
  QPDFObjectHandle example;
  QPDFObjectHandle number_tree_oh;
  QPDFObjectHandle root;
  undefined1 local_418 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_408 [5];
  element_type *local_3e0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3d8;
  iterator local_3d0;
  undefined1 local_3a0 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_390;
  _Alloc_hider local_388;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_380;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_378 [4];
  undefined1 local_358 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_348;
  string local_340 [32];
  element_type *local_320;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_318;
  long *local_310;
  long local_308;
  long local_300 [2];
  QPDF local_2f0 [8];
  iterator local_2e8;
  undefined8 local_2b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_2b0;
  QPDF local_2a0 [8];
  undefined8 local_298;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_290;
  undefined8 local_268;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_260 [2];
  undefined8 local_250;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_248;
  string local_240 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_238;
  element_type *local_230;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_228;
  char *local_220;
  string local_218 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_210;
  string local_208 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_200;
  string local_1f8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1f0;
  string local_1e8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1e0;
  string local_1d8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1d0;
  string local_1c8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1c0;
  string local_1b8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1b0;
  undefined1 local_1a8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1a0;
  iterator local_198;
  iterator local_150;
  iterator local_108;
  iterator local_c0;
  iterator local_78;
  
  whoami = (char *)QUtil::getWhoami(*argv);
  if (argc == 2) {
    local_220 = argv[1];
    QPDF::QPDF(local_2f0);
    QPDF::emptyPDF();
    QPDF::getRoot();
    QPDFObjectHandle::newDictionary();
    local_358._0_8_ = (element_type *)&local_348;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_358,"/Example","");
    QPDFObjectHandle::replaceKey(local_1b8,(QPDFObjectHandle *)local_358);
    if ((element_type *)local_358._0_8_ != (element_type *)&local_348) {
      operator_delete((void *)local_358._0_8_,(ulong)(local_348._M_pi + 1));
    }
    QPDFNameTreeObjectHelper::newEmpty(local_2a0,SUB81(local_2f0,0));
    local_250 = local_298;
    local_248 = local_290;
    if (local_290 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(local_290 + 8) = *(int *)(local_290 + 8) + 1;
        UNLOCK();
      }
      else {
        *(int *)(local_290 + 8) = *(int *)(local_290 + 8) + 1;
      }
    }
    local_358._0_8_ = (element_type *)&local_348;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_358,"/NameTree","");
    QPDFObjectHandle::replaceKey(local_240,(QPDFObjectHandle *)local_358);
    if ((element_type *)local_358._0_8_ != (element_type *)&local_348) {
      operator_delete((void *)local_358._0_8_,(ulong)(local_348._M_pi + 1));
    }
    local_358._0_8_ = (element_type *)&local_348;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_358,"K","");
    local_418._0_8_ = local_408;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"king","");
    QPDFObjectHandle::newUnicodeString(local_1c8);
    QVar12.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_358;
    QVar12.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_2a0;
    QPDFNameTreeObjectHelper::insert((string *)&local_78,QVar12);
    QPDFNameTreeObjectHelper::iterator::~iterator(&local_78);
    if (local_1c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1c0);
    }
    if ((element_type *)local_418._0_8_ != (element_type *)local_408) {
      operator_delete((void *)local_418._0_8_,(ulong)(local_408[0]._M_pi + 1));
    }
    if ((element_type *)local_358._0_8_ != (element_type *)&local_348) {
      operator_delete((void *)local_358._0_8_,(ulong)(local_348._M_pi + 1));
    }
    local_358._0_8_ = (element_type *)&local_348;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_358,"Q","");
    local_418._0_8_ = local_408;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"queen","");
    QPDFObjectHandle::newUnicodeString(local_1d8);
    QVar13.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_358;
    QVar13.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_2a0;
    QPDFNameTreeObjectHelper::insert((string *)&local_c0,QVar13);
    QPDFNameTreeObjectHelper::iterator::~iterator(&local_c0);
    if (local_1d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1d0);
    }
    if ((element_type *)local_418._0_8_ != (element_type *)local_408) {
      operator_delete((void *)local_418._0_8_,(ulong)(local_408[0]._M_pi + 1));
    }
    if ((element_type *)local_358._0_8_ != (element_type *)&local_348) {
      operator_delete((void *)local_358._0_8_,(ulong)(local_348._M_pi + 1));
    }
    local_358._0_8_ = (element_type *)&local_348;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_358,"R","");
    local_418._0_8_ = local_408;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"rook","");
    QPDFObjectHandle::newUnicodeString(local_1e8);
    QVar14.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_358;
    QVar14.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_2a0;
    QPDFNameTreeObjectHelper::insert((string *)&local_108,QVar14);
    QPDFNameTreeObjectHelper::iterator::~iterator(&local_108);
    if (local_1e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1e0);
    }
    if ((element_type *)local_418._0_8_ != (element_type *)local_408) {
      operator_delete((void *)local_418._0_8_,(ulong)(local_408[0]._M_pi + 1));
    }
    if ((element_type *)local_358._0_8_ != (element_type *)&local_348) {
      operator_delete((void *)local_358._0_8_,(ulong)(local_348._M_pi + 1));
    }
    local_358._0_8_ = (element_type *)&local_348;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_358,"B","");
    local_418._0_8_ = local_408;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"bishop","");
    QPDFObjectHandle::newUnicodeString(local_1f8);
    QVar15.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_358;
    QVar15.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_2a0;
    QPDFNameTreeObjectHelper::insert((string *)&local_150,QVar15);
    QPDFNameTreeObjectHelper::iterator::~iterator(&local_150);
    if (local_1f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1f0);
    }
    if ((element_type *)local_418._0_8_ != (element_type *)local_408) {
      operator_delete((void *)local_418._0_8_,(ulong)(local_408[0]._M_pi + 1));
    }
    if ((element_type *)local_358._0_8_ != (element_type *)&local_348) {
      operator_delete((void *)local_358._0_8_,(ulong)(local_348._M_pi + 1));
    }
    local_358._0_8_ = (element_type *)&local_348;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_358,"N","");
    local_418._0_8_ = local_408;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"knight","");
    QPDFObjectHandle::newUnicodeString(local_208);
    QVar16.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_358;
    QVar16.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_2a0;
    QPDFNameTreeObjectHelper::insert((string *)&local_198,QVar16);
    QPDFNameTreeObjectHelper::iterator::~iterator(&local_198);
    if (local_200 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_200);
    }
    if ((element_type *)local_418._0_8_ != (element_type *)local_408) {
      operator_delete((void *)local_418._0_8_,(ulong)(local_408[0]._M_pi + 1));
    }
    if ((element_type *)local_358._0_8_ != (element_type *)&local_348) {
      operator_delete((void *)local_358._0_8_,(ulong)(local_348._M_pi + 1));
    }
    local_418._0_8_ = local_408;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"P","");
    local_3a0._0_8_ = &local_390;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3a0,"pawn","");
    QPDFObjectHandle::newUnicodeString(local_218);
    QVar17.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_418;
    QVar17.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_2a0;
    QPDFNameTreeObjectHelper::insert((string *)local_358,QVar17);
    if (local_210 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_210);
    }
    if ((element_type *)local_3a0._0_8_ != (element_type *)&local_390) {
      operator_delete((void *)local_3a0._0_8_,(ulong)(local_390._M_pi + 1));
    }
    if ((element_type *)local_418._0_8_ != (element_type *)local_408) {
      operator_delete((void *)local_418._0_8_,(ulong)(local_408[0]._M_pi + 1));
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"just inserted ",0xe);
    puVar3 = (undefined8 *)QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)*puVar3,puVar3[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," -> ",4);
    QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
    QPDFObjectHandle::unparse_abi_cxx11_();
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,(char *)local_418._0_8_,local_418._8_8_);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    if ((element_type *)local_418._0_8_ != (element_type *)local_408) {
      operator_delete((void *)local_418._0_8_,(ulong)(local_408[0]._M_pi + 1));
    }
    QPDFNameTreeObjectHelper::iterator::operator--((iterator *)local_358);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"predecessor: ",0xd);
    puVar3 = (undefined8 *)QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)*puVar3,puVar3[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," -> ",4);
    QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
    QPDFObjectHandle::unparse_abi_cxx11_();
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,(char *)local_418._0_8_,local_418._8_8_);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    if ((element_type *)local_418._0_8_ != (element_type *)local_408) {
      operator_delete((void *)local_418._0_8_,(ulong)(local_408[0]._M_pi + 1));
    }
    QPDFNameTreeObjectHelper::iterator::operator++((iterator *)local_358);
    QPDFNameTreeObjectHelper::iterator::operator++((iterator *)local_358);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"successor: ",0xb);
    puVar3 = (undefined8 *)QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)*puVar3,puVar3[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," -> ",4);
    QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
    QPDFObjectHandle::unparse_abi_cxx11_();
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,(char *)local_418._0_8_,local_418._8_8_);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    if ((element_type *)local_418._0_8_ != (element_type *)local_408) {
      operator_delete((void *)local_418._0_8_,(ulong)(local_408[0]._M_pi + 1));
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Name tree items:",0x10);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
    std::ostream::put(-0x38);
    std::ostream::flush();
    QPDFNameTreeObjectHelper::begin();
    QPDFNameTreeObjectHelper::end();
    while( true ) {
      cVar1 = QPDFNameTreeObjectHelper::iterator::operator==
                        ((iterator *)local_418,(iterator *)local_3a0);
      if (cVar1 != '\0') break;
      ppVar5 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
                *)QPDFNameTreeObjectHelper::iterator::operator*[abi_cxx11_();
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
      ::pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
              *)&local_3d0,ppVar5);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)local_3d0._vptr_iterator,
                          (long)local_3d0.impl.
                                super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," -> ",4);
      QPDFObjectHandle::unparse_abi_cxx11_();
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,(char *)local_2e8._vptr_iterator,
                          (long)local_2e8.impl.
                                super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_2e8._vptr_iterator !=
          &local_2e8.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
         ) {
        operator_delete(local_2e8._vptr_iterator,
                        (ulong)(local_2e8.impl.
                                super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi + 1));
      }
      if (local_3d0.ivalue.second.super_BaseHandle.obj.
          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_3d0.ivalue.second.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
      if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_3d0._vptr_iterator !=
          &local_3d0.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
         ) {
        operator_delete(local_3d0._vptr_iterator,
                        (ulong)(local_3d0.impl.
                                super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi + 1));
      }
      QPDFNameTreeObjectHelper::iterator::operator++((iterator *)local_418);
    }
    QPDFNameTreeObjectHelper::iterator::~iterator((iterator *)local_3a0);
    QPDFNameTreeObjectHelper::iterator::~iterator((iterator *)local_418);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Keys in name tree object:",0x19);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
    std::ostream::put(-0x38);
    std::ostream::flush();
    local_268 = 0;
    a_Stack_260[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    QPDFObjectHandle::ditems();
    QPDFObjectHandle::QPDFDictItems::begin();
    QPDFObjectHandle::QPDFDictItems::end();
    while( true ) {
      cVar1 = QPDFObjectHandle::QPDFDictItems::iterator::operator==
                        ((iterator *)local_418,(iterator *)local_3a0);
      if (cVar1 != '\0') break;
      pcVar6 = (char *)QPDFObjectHandle::QPDFDictItems::iterator::operator*[abi_cxx11_();
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,*(char **)pcVar6,*(long *)(pcVar6 + 8));
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      iVar2 = std::__cxx11::string::compare(pcVar6);
      if (iVar2 == 0) {
        local_268 = *(undefined8 *)(pcVar6 + 0x20);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (a_Stack_260,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(pcVar6 + 0x28));
      }
      QPDFObjectHandle::QPDFDictItems::iterator::operator++((iterator *)local_418);
    }
    QPDFObjectHandle::QPDFDictItems::iterator::~iterator((iterator *)local_3a0);
    QPDFObjectHandle::QPDFDictItems::iterator::~iterator((iterator *)local_418);
    if (local_3d0.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_3d0.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Values in names:",0x10);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
    std::ostream::put(-0x38);
    std::ostream::flush();
    QPDFObjectHandle::aitems();
    QPDFObjectHandle::QPDFArrayItems::begin();
    QPDFObjectHandle::QPDFArrayItems::end();
    while( true ) {
      cVar1 = QPDFObjectHandle::QPDFArrayItems::iterator::operator==
                        ((iterator *)local_418,(iterator *)local_3a0);
      if (cVar1 != '\0') break;
      QPDFObjectHandle::QPDFArrayItems::iterator::operator*((iterator *)local_418);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
      QPDFObjectHandle::unparse_abi_cxx11_();
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)local_3d0._vptr_iterator,
                          (long)local_3d0.impl.
                                super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_3d0._vptr_iterator !=
          &local_3d0.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
         ) {
        operator_delete(local_3d0._vptr_iterator,
                        (ulong)(local_3d0.impl.
                                super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi + 1));
      }
      QPDFObjectHandle::QPDFArrayItems::iterator::operator++((iterator *)local_418);
    }
    QPDFObjectHandle::QPDFArrayItems::iterator::~iterator((iterator *)local_3a0);
    QPDFObjectHandle::QPDFArrayItems::iterator::~iterator((iterator *)local_418);
    if (local_2e8.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_2e8.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Has Q?: ",8);
    local_418._0_8_ = local_408;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"Q","");
    QPDFNameTreeObjectHelper::hasName((string *)local_2a0);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    if ((element_type *)local_418._0_8_ != (element_type *)local_408) {
      operator_delete((void *)local_418._0_8_,(ulong)(local_408[0]._M_pi + 1));
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Has W?: ",8);
    local_418._0_8_ = local_408;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"W","");
    QPDFNameTreeObjectHelper::hasName((string *)local_2a0);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    if ((element_type *)local_418._0_8_ != (element_type *)local_408) {
      operator_delete((void *)local_418._0_8_,(ulong)(local_408[0]._M_pi + 1));
    }
    local_2b8 = 0;
    p_Stack_2b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Found W?: ",10);
    local_418._0_8_ = local_408;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"W","");
    QPDFNameTreeObjectHelper::findObject((string *)local_2a0,(QPDFObjectHandle *)local_418);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    if ((element_type *)local_418._0_8_ != (element_type *)local_408) {
      operator_delete((void *)local_418._0_8_,(ulong)(local_408[0]._M_pi + 1));
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Found Q?: ",10);
    local_418._0_8_ = local_408;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"Q","");
    QPDFNameTreeObjectHelper::findObject((string *)local_2a0,(QPDFObjectHandle *)local_418);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    if ((element_type *)local_418._0_8_ != (element_type *)local_408) {
      operator_delete((void *)local_418._0_8_,(ulong)(local_408[0]._M_pi + 1));
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Q: ",3);
    QPDFObjectHandle::unparse_abi_cxx11_();
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_418._0_8_,local_418._8_8_);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    if ((element_type *)local_418._0_8_ != (element_type *)local_408) {
      operator_delete((void *)local_418._0_8_,(ulong)(local_408[0]._M_pi + 1));
    }
    local_3a0._0_8_ = &local_390;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3a0,"Q","");
    QPDFNameTreeObjectHelper::find((string *)local_418,SUB81(local_2a0,0));
    local_358._8_8_ = local_418._8_8_;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(&local_348,local_408);
    std::__cxx11::string::_M_assign(local_340);
    local_320 = local_3e0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(&local_318,&local_3d8);
    QPDFNameTreeObjectHelper::iterator::~iterator((iterator *)local_418);
    if ((element_type *)local_3a0._0_8_ != (element_type *)&local_390) {
      operator_delete((void *)local_3a0._0_8_,(ulong)(local_390._M_pi + 1));
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Q: ",3);
    puVar3 = (undefined8 *)QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)*puVar3,puVar3[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," -> ",4);
    QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
    QPDFObjectHandle::unparse_abi_cxx11_();
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,(char *)local_418._0_8_,local_418._8_8_);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    if ((element_type *)local_418._0_8_ != (element_type *)local_408) {
      operator_delete((void *)local_418._0_8_,(ulong)(local_408[0]._M_pi + 1));
    }
    local_3a0._0_8_ = &local_390;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3a0,"W","");
    QPDFNameTreeObjectHelper::find((string *)local_418,SUB81(local_2a0,0));
    local_358._8_8_ = local_418._8_8_;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(&local_348,local_408);
    std::__cxx11::string::_M_assign(local_340);
    local_320 = local_3e0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(&local_318,&local_3d8);
    QPDFNameTreeObjectHelper::iterator::~iterator((iterator *)local_418);
    if ((element_type *)local_3a0._0_8_ != (element_type *)&local_390) {
      operator_delete((void *)local_3a0._0_8_,(ulong)(local_390._M_pi + 1));
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"W found: ",9);
    QPDFNameTreeObjectHelper::end();
    QPDFNameTreeObjectHelper::iterator::operator==((iterator *)local_358,(iterator *)local_418);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    QPDFNameTreeObjectHelper::iterator::~iterator((iterator *)local_418);
    local_3a0._0_8_ = &local_390;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3a0,"W","");
    QPDFNameTreeObjectHelper::find((string *)local_418,SUB81(local_2a0,0));
    local_358._8_8_ = local_418._8_8_;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(&local_348,local_408);
    std::__cxx11::string::_M_assign(local_340);
    local_320 = local_3e0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(&local_318,&local_3d8);
    QPDFNameTreeObjectHelper::iterator::~iterator((iterator *)local_418);
    if ((element_type *)local_3a0._0_8_ != (element_type *)&local_390) {
      operator_delete((void *)local_3a0._0_8_,(ulong)(local_390._M_pi + 1));
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"W\'s predecessor: ",0x11);
    puVar3 = (undefined8 *)QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)*puVar3,puVar3[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," -> ",4);
    QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
    QPDFObjectHandle::unparse_abi_cxx11_();
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,(char *)local_418._0_8_,local_418._8_8_);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    if ((element_type *)local_418._0_8_ != (element_type *)local_408) {
      operator_delete((void *)local_418._0_8_,(ulong)(local_408[0]._M_pi + 1));
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Remove P: ",10);
    local_418._0_8_ = (element_type *)local_408;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"P","");
    QPDFNameTreeObjectHelper::remove((string *)local_2a0,(QPDFObjectHandle *)local_418);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    if ((element_type *)local_418._0_8_ != (element_type *)local_408) {
      operator_delete((void *)local_418._0_8_,(ulong)(local_408[0]._M_pi + 1));
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Value removed: ",0xf);
    QPDFObjectHandle::unparse_abi_cxx11_();
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_418._0_8_,local_418._8_8_);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    if ((element_type *)local_418._0_8_ != (element_type *)local_408) {
      operator_delete((void *)local_418._0_8_,(ulong)(local_408[0]._M_pi + 1));
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Has P?: ",8);
    local_418._0_8_ = (element_type *)local_408;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"P","");
    QPDFNameTreeObjectHelper::hasName((string *)local_2a0);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    if ((element_type *)local_418._0_8_ != (element_type *)local_408) {
      operator_delete((void *)local_418._0_8_,(ulong)(local_408[0]._M_pi + 1));
    }
    local_3a0._0_8_ = &local_390;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3a0,"K","");
    QPDFNameTreeObjectHelper::find((string *)local_418,SUB81(local_2a0,0));
    local_358._8_8_ = local_418._8_8_;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(&local_348,local_408);
    std::__cxx11::string::_M_assign(local_340);
    local_320 = local_3e0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(&local_318,&local_3d8);
    QPDFNameTreeObjectHelper::iterator::~iterator((iterator *)local_418);
    if ((element_type *)local_3a0._0_8_ != (element_type *)&local_390) {
      operator_delete((void *)local_3a0._0_8_,(ulong)(local_390._M_pi + 1));
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Find K: ",8);
    QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
    QPDFObjectHandle::unparse_abi_cxx11_();
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_418._0_8_,local_418._8_8_);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    if ((element_type *)local_418._0_8_ != (element_type *)local_408) {
      operator_delete((void *)local_418._0_8_,(ulong)(local_408[0]._M_pi + 1));
    }
    QPDFNameTreeObjectHelper::iterator::remove();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Iter after removing K: ",0x17);
    puVar3 = (undefined8 *)QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)*puVar3,puVar3[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," -> ",4);
    QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
    QPDFObjectHandle::unparse_abi_cxx11_();
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,(char *)local_418._0_8_,local_418._8_8_);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    if ((element_type *)local_418._0_8_ != (element_type *)local_408) {
      operator_delete((void *)local_418._0_8_,(ulong)(local_408[0]._M_pi + 1));
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Has K?: ",8);
    local_418._0_8_ = (element_type *)local_408;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"K","");
    QPDFNameTreeObjectHelper::hasName((string *)local_2a0);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    if ((element_type *)local_418._0_8_ != (element_type *)local_408) {
      operator_delete((void *)local_418._0_8_,(ulong)(local_408[0]._M_pi + 1));
    }
    QPDFNumberTreeObjectHelper::newEmpty((QPDF *)local_418,SUB81(local_2f0,0));
    local_230 = (element_type *)local_418._8_8_;
    local_228 = local_408[0]._M_pi;
    if (local_408[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(local_408[0]._M_pi + 8) = *(int *)(local_408[0]._M_pi + 8) + 1;
        UNLOCK();
      }
      else {
        *(int *)(local_408[0]._M_pi + 8) = *(int *)(local_408[0]._M_pi + 8) + 1;
      }
    }
    local_3a0._0_8_ = &local_390;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3a0,"/NumberTree","");
    QPDFObjectHandle::replaceKey(local_240,(QPDFObjectHandle *)local_3a0);
    if ((element_type *)local_3a0._0_8_ != (element_type *)&local_390) {
      operator_delete((void *)local_3a0._0_8_,(ulong)(local_390._M_pi + 1));
    }
    QPDFNumberTreeObjectHelper::begin();
    peVar10 = (element_type *)0x7;
    do {
      __len = 3 - (peVar10 < (element_type *)0x64);
      if (peVar10 < (element_type *)0xa) {
        __len = 1;
      }
      local_310 = local_300;
      std::__cxx11::string::_M_construct((ulong)&local_310,(char)__len);
      std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_310,__len,(uint)peVar10);
      plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_310,0,(char *)0x0,0x106197);
      local_2e8._vptr_iterator =
           (_func_int **)
           &local_2e8.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount;
      plVar8 = plVar7 + 2;
      if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)*plVar7 ==
          (__shared_count<(__gnu_cxx::_Lock_policy)2> *)plVar8) {
        local_2e8.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*plVar8;
        local_2e8.ivalue.first = plVar7[3];
      }
      else {
        local_2e8.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*plVar8;
        local_2e8._vptr_iterator = (_func_int **)*plVar7;
      }
      local_2e8.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)plVar7[1];
      *plVar7 = (long)plVar8;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_2e8);
      local_3d0._vptr_iterator =
           (_func_int **)
           &local_3d0.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount;
      plVar8 = plVar7 + 2;
      if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)*plVar7 ==
          (__shared_count<(__gnu_cxx::_Lock_policy)2> *)plVar8) {
        local_3d0.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*plVar8;
        local_3d0.ivalue.first = plVar7[3];
      }
      else {
        local_3d0.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*plVar8;
        local_3d0._vptr_iterator = (_func_int **)*plVar7;
      }
      local_3d0.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)plVar7[1];
      *plVar7 = (long)plVar8;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      QPDFObjectHandle::newString((string *)local_1a8);
      QVar18.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8;
      QVar18.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = peVar10;
      QPDFNumberTreeObjectHelper::iterator::insertAfter((longlong)local_3a0,QVar18);
      if (local_1a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1a0);
      }
      if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_3d0._vptr_iterator !=
          &local_3d0.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
         ) {
        operator_delete(local_3d0._vptr_iterator,
                        (ulong)(local_3d0.impl.
                                super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi + 1));
      }
      if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_2e8._vptr_iterator !=
          &local_2e8.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
         ) {
        operator_delete(local_2e8._vptr_iterator,
                        (ulong)(local_2e8.impl.
                                super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi + 1));
      }
      if (local_310 != local_300) {
        operator_delete(local_310,local_300[0] + 1);
      }
      bVar11 = peVar10 < (element_type *)0x158;
      peVar10 = peVar10 + 7;
    } while (bVar11);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Numbers:",8);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
    std::ostream::put(-0x38);
    std::ostream::flush();
    QPDFNumberTreeObjectHelper::begin();
    QPDFNumberTreeObjectHelper::end();
    uVar9 = 1;
    iVar2 = -1;
    while( true ) {
      cVar1 = QPDFNumberTreeObjectHelper::iterator::operator==(&local_3d0,&local_2e8);
      if (cVar1 != '\0') break;
      QPDFNumberTreeObjectHelper::iterator::operator*(&local_3d0);
      poVar4 = std::ostream::_M_insert<long_long>((longlong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," -> ",4);
      QPDFObjectHandle::getUTF8Value_abi_cxx11_();
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)local_310,local_308);
      if (local_310 != local_300) {
        operator_delete(local_310,local_300[0] + 1);
      }
      if ((int)(uVar9 / 5) * 5 + iVar2 == 0) {
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
        std::ostream::put(-0x38);
        std::ostream::flush();
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
      }
      uVar9 = (ulong)((int)uVar9 + 1);
      iVar2 = iVar2 + -1;
      QPDFNumberTreeObjectHelper::iterator::operator++(&local_3d0);
    }
    QPDFNumberTreeObjectHelper::iterator::~iterator(&local_2e8);
    QPDFNumberTreeObjectHelper::iterator::~iterator(&local_3d0);
    QPDFNumberTreeObjectHelper::begin();
    local_3a0._8_8_ =
         local_3d0.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&local_390,
               &local_3d0.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    local_388._M_p = (pointer)local_3d0.ivalue.first;
    _Stack_380._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         local_3d0.ivalue.second.super_BaseHandle.obj.
         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (local_378,
               (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&local_3d0.ivalue.second.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> + 8));
    QPDFNumberTreeObjectHelper::iterator::~iterator(&local_3d0);
    while( true ) {
      QPDFNumberTreeObjectHelper::end();
      cVar1 = QPDFNumberTreeObjectHelper::iterator::operator==((iterator *)local_3a0,&local_3d0);
      QPDFNumberTreeObjectHelper::iterator::~iterator(&local_3d0);
      if (cVar1 != '\0') break;
      plVar7 = (long *)QPDFNumberTreeObjectHelper::iterator::operator->((iterator *)local_3a0);
      if (*plVar7 * -0x3333333333333333 + 0x1999999999999999U < 0x3333333333333333) {
        QPDFNumberTreeObjectHelper::iterator::remove();
      }
      else {
        QPDFNumberTreeObjectHelper::iterator::operator++((iterator *)local_3a0);
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Numbers after filtering:",0x18);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
    std::ostream::put(-0x38);
    std::ostream::flush();
    QPDFNumberTreeObjectHelper::begin();
    QPDFNumberTreeObjectHelper::end();
    uVar9 = 1;
    iVar2 = -1;
    while( true ) {
      cVar1 = QPDFNumberTreeObjectHelper::iterator::operator==(&local_3d0,&local_2e8);
      if (cVar1 != '\0') break;
      QPDFNumberTreeObjectHelper::iterator::operator*(&local_3d0);
      poVar4 = std::ostream::_M_insert<long_long>((longlong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," -> ",4);
      QPDFObjectHandle::getUTF8Value_abi_cxx11_();
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)local_310,local_308);
      if (local_310 != local_300) {
        operator_delete(local_310,local_300[0] + 1);
      }
      if ((int)(uVar9 / 5) * 5 + iVar2 == 0) {
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
        std::ostream::put(-0x38);
        std::ostream::flush();
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
      }
      uVar9 = (ulong)((int)uVar9 + 1);
      iVar2 = iVar2 + -1;
      QPDFNumberTreeObjectHelper::iterator::operator++(&local_3d0);
    }
    QPDFNumberTreeObjectHelper::iterator::~iterator(&local_2e8);
    QPDFNumberTreeObjectHelper::iterator::~iterator(&local_3d0);
    QPDFWriter::QPDFWriter((QPDFWriter *)&local_3d0,local_2f0,local_220);
    QPDFWriter::setQDFMode(SUB81(&local_3d0,0));
    QPDFWriter::setStaticID(SUB81(&local_3d0,0));
    QPDFWriter::write();
    if (local_3d0.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_3d0.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr);
    }
    QPDFNumberTreeObjectHelper::iterator::~iterator((iterator *)local_3a0);
    if (local_228 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_228);
    }
    QPDFNumberTreeObjectHelper::~QPDFNumberTreeObjectHelper((QPDFNumberTreeObjectHelper *)local_418)
    ;
    if (p_Stack_2b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_2b0);
    }
    if (a_Stack_260[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_260[0]._M_pi);
    }
    QPDFNameTreeObjectHelper::iterator::~iterator((iterator *)local_358);
    if (local_248 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_248);
    }
    QPDFNameTreeObjectHelper::~QPDFNameTreeObjectHelper((QPDFNameTreeObjectHelper *)local_2a0);
    if (local_238 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_238);
    }
    if (local_1b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1b0);
    }
    QPDF::~QPDF(local_2f0);
    return 0;
  }
  usage();
  QPDFNumberTreeObjectHelper::iterator::~iterator((iterator *)local_3a0);
  if (local_228 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_228);
  }
  QPDFNumberTreeObjectHelper::~QPDFNumberTreeObjectHelper((QPDFNumberTreeObjectHelper *)local_418);
  if (p_Stack_2b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_2b0);
  }
  if (a_Stack_260[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_260[0]._M_pi);
  }
  QPDFNameTreeObjectHelper::iterator::~iterator((iterator *)local_358);
  if (local_248 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_248);
  }
  QPDFNameTreeObjectHelper::~QPDFNameTreeObjectHelper((QPDFNameTreeObjectHelper *)local_2a0);
  if (local_238 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_238);
  }
  if (local_1b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1b0);
  }
  QPDF::~QPDF(local_2f0);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

int
main(int argc, char* argv[])
{
    whoami = QUtil::getWhoami(argv[0]);

    if (argc != 2) {
        usage();
    }

    char const* outfilename = argv[1];

    QPDF qpdf;
    qpdf.emptyPDF();

    // This example doesn't do anything particularly useful other than just illustrate how to use
    // the APIs for name and number trees. It also demonstrates use of the iterators for
    // dictionaries and arrays introduced at the same time with qpdf 10.2.

    // To use this example, compile it and run it. Study the output and compare it to what you
    // expect. When done, look at the generated output file in a text editor to inspect the
    // structure of the trees as left in the file.

    // We're just going to create some name and number trees, hang them off the document catalog
    // (root), and write an empty PDF to a file. The PDF will have no pages and won't be viewable,
    // but you can look at it in a text editor to see the resulting structure of the PDF.

    // Create a dictionary off the root where we will hang our name and number trees.
    auto root = qpdf.getRoot();
    auto example = QPDFObjectHandle::newDictionary();
    root.replaceKey("/Example", example);

    // Create a name tree, attach it to the file, and add some items.
    auto name_tree = QPDFNameTreeObjectHelper::newEmpty(qpdf);
    auto name_tree_oh = name_tree.getObjectHandle();
    example.replaceKey("/NameTree", name_tree_oh);
    name_tree.insert("K", QPDFObjectHandle::newUnicodeString("king"));
    name_tree.insert("Q", QPDFObjectHandle::newUnicodeString("queen"));
    name_tree.insert("R", QPDFObjectHandle::newUnicodeString("rook"));
    name_tree.insert("B", QPDFObjectHandle::newUnicodeString("bishop"));
    name_tree.insert("N", QPDFObjectHandle::newUnicodeString("knight"));
    auto iter = name_tree.insert("P", QPDFObjectHandle::newUnicodeString("pawn"));
    // Look at the iterator
    std::cout << "just inserted " << iter->first << " -> " << iter->second.unparse() << std::endl;
    --iter;
    std::cout << "predecessor: " << iter->first << " -> " << iter->second.unparse() << std::endl;
    ++iter;
    ++iter;
    std::cout << "successor: " << iter->first << " -> " << iter->second.unparse() << std::endl;

    // Use range-for iteration
    std::cout << "Name tree items:" << std::endl;
    for (auto i: name_tree) {
        std::cout << "  " << i.first << " -> " << i.second.unparse() << std::endl;
    }

    // This is a small tree, so everything will be at the root. We can look at it using dictionary
    // and array iterators.
    std::cout << "Keys in name tree object:" << std::endl;
    QPDFObjectHandle names;
    for (auto const& i: name_tree_oh.ditems()) {
        std::cout << i.first << std::endl;
        if (i.first == "/Names") {
            names = i.second;
        }
    }
    // Values in names array:
    std::cout << "Values in names:" << std::endl;
    for (auto& i: names.aitems()) {
        std::cout << "  " << i.unparse() << std::endl;
    }

    // pre 10.2 API
    std::cout << "Has Q?: " << name_tree.hasName("Q") << std::endl;
    std::cout << "Has W?: " << name_tree.hasName("W") << std::endl;
    QPDFObjectHandle obj;
    std::cout << "Found W?: " << name_tree.findObject("W", obj) << std::endl;
    std::cout << "Found Q?: " << name_tree.findObject("Q", obj) << std::endl;
    std::cout << "Q: " << obj.unparse() << std::endl;

    // 10.2 API
    iter = name_tree.find("Q");
    std::cout << "Q: " << iter->first << " -> " << iter->second.unparse() << std::endl;
    iter = name_tree.find("W");
    std::cout << "W found: " << (iter != name_tree.end()) << std::endl;
    // Allow find to return predecessor
    iter = name_tree.find("W", true);
    std::cout << "W's predecessor: " << iter->first << " -> " << iter->second.unparse()
              << std::endl;

    // We can also remove items
    std::cout << "Remove P: " << name_tree.remove("P", &obj) << std::endl;
    std::cout << "Value removed: " << obj.unparse() << std::endl;
    std::cout << "Has P?: " << name_tree.hasName("P") << std::endl;
    // Or we can remove using an iterator
    iter = name_tree.find("K");
    std::cout << "Find K: " << iter->second.unparse() << std::endl;
    iter.remove();
    std::cout << "Iter after removing K: " << iter->first << " -> " << iter->second.unparse()
              << std::endl;
    std::cout << "Has K?: " << name_tree.hasName("K") << std::endl;

    // Illustrate some more advanced usage using number trees. These calls work for name trees too.

    // The safe way to populate a tree is to call insert repeatedly as above, but if you know you
    // are definitely inserting items in order, it is more efficient to insert them using
    // insertAfter, which avoids doing a binary search through the tree for each insertion. Note
    // that if you don't insert items in order using this method, you will create an invalid tree.
    auto number_tree = QPDFNumberTreeObjectHelper::newEmpty(qpdf);
    auto number_tree_oh = number_tree.getObjectHandle();
    example.replaceKey("/NumberTree", number_tree_oh);
    auto iter2 = number_tree.begin();
    for (int i = 7; i <= 350; i += 7) {
        iter2.insertAfter(i, QPDFObjectHandle::newString("-" + std::to_string(i) + "-"));
    }
    std::cout << "Numbers:" << std::endl;
    int n = 1;
    for (auto& i: number_tree) {
        std::cout << i.first << " -> " << i.second.getUTF8Value();
        if (n % 5) {
            std::cout << ", ";
        } else {
            std::cout << std::endl;
        }
        ++n;
    }

    // When you remove an item with an iterator, the iterator advances. This makes it possible to
    // filter while iterating. Remove all items that are multiples of 5.
    iter2 = number_tree.begin();
    while (iter2 != number_tree.end()) {
        if (iter2->first % 5 == 0) {
            iter2.remove(); // also advances
        } else {
            ++iter2;
        }
    }
    std::cout << "Numbers after filtering:" << std::endl;
    n = 1;
    for (auto& i: number_tree) {
        std::cout << i.first << " -> " << i.second.getUTF8Value();
        if (n % 5) {
            std::cout << ", ";
        } else {
            std::cout << std::endl;
        }
        ++n;
    }

    // Write to an output file
    QPDFWriter w(qpdf, outfilename);
    w.setQDFMode(true);
    w.setStaticID(true); // for testing only
    w.write();

    return 0;
}